

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlBegin(int mode)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  DrawCall *pDVar4;
  _Bool _Var5;
  uint uVar6;
  int iVar7;
  RenderBatch *batch;
  
  pDVar4 = (RLGL.currentBatch)->draws;
  iVar7 = (RLGL.currentBatch)->drawsCounter;
  iVar2 = pDVar4[(long)iVar7 + -1].mode;
  if (iVar2 != mode) {
    uVar3 = pDVar4[(long)iVar7 + -1].vertexCount;
    batch = RLGL.currentBatch;
    if (0 < (int)uVar3) {
      if (iVar2 == 4) {
        uVar6 = 1;
        if (3 < uVar3) {
          uVar6 = 4 - (uVar3 & 3);
        }
      }
      else {
        uVar6 = 0;
        if (iVar2 == 1) {
          uVar6 = uVar3 & 3;
        }
      }
      pDVar4[(long)iVar7 + -1].vertexAlignment = uVar6;
      _Var5 = rlCheckRenderBatchLimit
                        ((RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawsCounter + -1].
                         vertexAlignment);
      if (_Var5) {
        iVar7 = (RLGL.currentBatch)->drawsCounter;
        batch = RLGL.currentBatch;
      }
      else {
        piVar1 = &(RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vCounter;
        *piVar1 = *piVar1 + (RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawsCounter + -1]
                            .vertexAlignment;
        piVar1 = &(RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].cCounter;
        *piVar1 = *piVar1 + (RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawsCounter + -1]
                            .vertexAlignment;
        piVar1 = &(RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].tcCounter;
        *piVar1 = *piVar1 + (RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawsCounter + -1]
                            .vertexAlignment;
        batch = RLGL.currentBatch;
        iVar7 = (RLGL.currentBatch)->drawsCounter + 1;
        (RLGL.currentBatch)->drawsCounter = iVar7;
      }
    }
    if (0xff < iVar7) {
      rlDrawRenderBatch(batch);
      iVar7 = (RLGL.currentBatch)->drawsCounter;
      batch = RLGL.currentBatch;
    }
    batch->draws[(long)iVar7 + -1].mode = mode;
    (RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawsCounter + -1].vertexCount = 0;
    (RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawsCounter + -1].textureId =
         RLGL.State.defaultTextureId;
  }
  return;
}

Assistant:

void rlBegin(int mode)
{
    // Draw mode can be RL_LINES, RL_TRIANGLES and RL_QUADS
    // NOTE: In all three cases, vertex are accumulated over default internal vertex buffer
    if (RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].mode != mode)
    {
        if (RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount > 0)
        {
            // Make sure current RLGL.currentBatch->draws[i].vertexCount is aligned a multiple of 4,
            // that way, following QUADS drawing will keep aligned with index processing
            // It implies adding some extra alignment vertex at the end of the draw,
            // those vertex are not processed but they are considered as an additional offset
            // for the next set of vertex to be drawn
            if (RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].mode == RL_LINES) RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment = ((RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount < 4)? RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount : RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount%4);
            else if (RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].mode == RL_TRIANGLES) RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment = ((RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount < 4)? 1 : (4 - (RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount%4)));
            else RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment = 0;

            if (!rlCheckRenderBatchLimit(RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment))
            {
                RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter += RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment;
                RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].cCounter += RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment;
                RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].tcCounter += RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment;

                RLGL.currentBatch->drawsCounter++;
            }
        }

        if (RLGL.currentBatch->drawsCounter >= DEFAULT_BATCH_DRAWCALLS) rlDrawRenderBatch(RLGL.currentBatch);

        RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].mode = mode;
        RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount = 0;
        RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].textureId = RLGL.State.defaultTextureId;
    }
}